

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu-flags.c
# Opt level: O2

void cpu_flags_get(void)

{
  uint *puVar1;
  int *piVar2;
  int *piVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  
  cpu_flags = 0;
  uVar6 = 0;
  puVar1 = (uint *)cpuid_basic_info(0);
  piVar2 = (int *)cpuid(0x80000000);
  if (*puVar1 != 0) {
    piVar3 = (int *)cpuid_Version_info(1);
    if (*piVar3 == 0) {
      uVar6 = 0;
    }
    else {
      uVar6 = (piVar3[3] & 0x200U) >> 8 | (piVar3[2] & 0x4000000U) >> 0x1a;
      if ((piVar3[3] & 0x200U) != 0 || (piVar3[2] & 0x4000000U) != 0) {
        cpu_flags = uVar6;
      }
    }
    if (6 < *puVar1) {
      lVar4 = cpuid_Extended_Feature_Enumeration_info(7);
      uVar5 = *(uint *)(lVar4 + 4);
      uVar6 = uVar5 >> 0xc & 0x10 | uVar5 >> 2 & 8 | uVar6;
      if ((uVar5 & 0x10020) != 0) {
        cpu_flags = uVar6;
      }
    }
  }
  if ((*piVar2 != 0) &&
     (piVar2 = (int *)cpuid(0x80000001), ((uint)piVar2[3] >> 0xb & 1) != 0 && *piVar2 != 0)) {
    cpu_flags = uVar6 | 4;
  }
  return;
}

Assistant:

void cpu_flags_get(void)
{
    unsigned int ebx, ecx, edx;
    unsigned int level, level_ext;

    cpu_flags = 0;
    level     = get_cpuid(0, 0, &ebx, &ecx, &edx);
    level_ext = get_cpuid(1, 0, &ebx, &ecx, &edx);

    if (level >= 1 && get_cpuid(0, 1, &ebx, &ecx, &edx)) {
        if (edx & (1 << 26)) {
            cpu_flags |= X86_64_FEATURE_SSE2;
        }
        if (ecx & (1 << 9)) {
            cpu_flags |= X86_64_FEATURE_SSSE3;
        }
    }
    if (level >= 7 && get_cpuid_count(0, 7, 0, &ebx, &ecx, &edx)) {
        if (ebx & (1 << 5)) {
            cpu_flags |= X86_64_FEATURE_AVX2;
        }
        if (ebx & (1 << 16)) {
            cpu_flags |= X86_64_FEATURE_AVX512F;
        }
    }
    if (level_ext >= 1 && get_cpuid(1, 1, &ebx, &ecx, &edx)) {
        if (ecx & (1 << 11)) {
            cpu_flags |= X86_64_FEATURE_XOP;
        }
    }
    /* FIXME: check also OS support! */
}